

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_add(JSON_Array *array,JSON_Value *value)

{
  JSON_Status JVar1;
  JSON_Value *pJVar2;
  size_t local_30;
  size_t new_capacity;
  JSON_Value *value_local;
  JSON_Array *array_local;
  
  if (array->capacity <= array->count) {
    if (array->capacity * 2 < 0x11) {
      local_30 = 0x10;
    }
    else {
      local_30 = array->capacity << 1;
    }
    JVar1 = json_array_resize(array,local_30);
    if (JVar1 != 0) {
      return -1;
    }
  }
  pJVar2 = json_array_get_wrapping_value(array);
  value->parent = pJVar2;
  array->items[array->count] = value;
  array->count = array->count + 1;
  return 0;
}

Assistant:

static JSON_Status json_array_add(JSON_Array *array, JSON_Value *value) {
    if (array->count >= array->capacity) {
        size_t new_capacity = MAX(array->capacity * 2, STARTING_CAPACITY);
        if (json_array_resize(array, new_capacity) != JSONSuccess) {
            return JSONFailure;
        }
    }
    value->parent = json_array_get_wrapping_value(array);
    array->items[array->count] = value;
    array->count++;
    return JSONSuccess;
}